

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign_extension.c
# Opt level: O3

uint32_t sign_extend_word(uint32_t v,int old,int new)

{
  uint uVar1;
  uint32_t extraout_EAX;
  ulong uVar2;
  undefined4 in_register_0000003c;
  arm7tdmi_t *state;
  
  state = (arm7tdmi_t *)CONCAT44(in_register_0000003c,v);
  uVar2 = (ulong)(uint)old;
  if (old <= new) {
    uVar1 = 1 << ((char)old - 1U & 0x1f) & v;
    return (v ^ uVar1) - uVar1;
  }
  sign_extend_word_cold_1();
  if (gba_log_verbosity != 0) {
    printf("\x1b[0;33m[WARN]  adjusted pc: 0x%08X: SWI: 0x%X - %s\n\x1b[0;m",
           (ulong)((state->pc + (((state->cpsr).raw & 0x20) >> 3)) - 8),uVar2 & 0xff,
           SWI_NAMES_rel + *(int *)(SWI_NAMES_rel + (uVar2 & 0xff) * 4));
  }
  uVar1 = (state->cpsr).raw;
  (state->cpsr).raw = uVar1 & 0xffffffe0 | 0x13;
  set_spsr(state,uVar1);
  state->lr_svc = (state->pc + (((state->cpsr).raw & 0x20) >> 4)) - 4;
  (state->cpsr).raw = (state->cpsr).raw & 0xffffff5f | 0x80;
  set_pc(state,8);
  return extraout_EAX;
}

Assistant:

word sign_extend_word(word v, int old, int new) {
    unimplemented(new < old, "Can't downsize signed values with this function!")

    word mask = v & (1 << (old - 1));
    bool s = mask > 0;
    if (s) {
        return (v ^ mask) - mask;
    }
    else {
        return v; // No sign bit set, don't need to sign extend
    }
}